

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGXMLScanner.cpp
# Opt level: O2

bool __thiscall
xercesc_4_0::SGXMLScanner::normalizeAttValue
          (SGXMLScanner *this,XMLAttDef *attDef,XMLCh *attName,XMLCh *value,XMLBuffer *toFill)

{
  XMLByte XVar1;
  AttTypes AVar2;
  XMLByte *pXVar3;
  XMLCh XVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  byte local_41;
  
  if (attDef == (XMLAttDef *)0x0) {
    toFill->fIndex = 0;
    local_41 = 1;
  }
  else {
    AVar2 = attDef->fType;
    toFill->fIndex = 0;
    local_41 = attDef->fExternalAttribute ^ 1U | (uint)(AVar2 + ~NmTokens) < 0xfffffff9;
    if (AVar2 < Enumeration && AVar2 != AttTypes_Min) {
      bVar5 = true;
      bVar6 = false;
      do {
        bVar7 = false;
        while( true ) {
          while( true ) {
            XVar4 = *value;
            if (XVar4 == L'<') {
              bVar5 = false;
              XMLScanner::emitError
                        (&this->super_XMLScanner,BracketInAttrValue,attName,(XMLCh *)0x0,
                         (XMLCh *)0x0,(XMLCh *)0x0);
              XVar4 = L'<';
            }
            else if (XVar4 == L'\xffff') {
              XVar4 = value[1];
              value = value + 1;
            }
            else if (XVar4 == L'\0') {
              return bVar5;
            }
            pXVar3 = ((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable;
            XVar1 = pXVar3[(ushort)XVar4];
            if (bVar7) break;
            if (-1 < (char)XVar1) goto LAB_002b7a5b;
            value = value + 1;
            bVar7 = true;
            if ((((this->super_XMLScanner).fStandalone == true) &&
                ((this->super_XMLScanner).fValidate == true && local_41 == 0)) &&
               ((!bVar6 ||
                (((XVar4 != L' ' && ((ulong)(ushort)*value != 0)) &&
                 ((char)pXVar3[(ushort)*value] < '\0')))))) {
              XMLValidator::emitError
                        ((this->super_XMLScanner).fValidator,NoAttNormForStandalone,attName,
                         (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
            }
          }
          if (-1 < (char)XVar1) break;
          value = value + 1;
          bVar7 = true;
        }
        if (bVar6) {
          XMLBuffer::append(toFill,L' ');
        }
LAB_002b7a5b:
        XMLBuffer::append(toFill,XVar4);
        value = value + 1;
        bVar6 = true;
      } while( true );
    }
  }
  bVar6 = true;
  do {
    XVar4 = *value;
    if (XVar4 == L'\xffff') {
      XVar4 = value[1];
      value = value + 1;
    }
    else {
      if (XVar4 == L'\0') {
        return bVar6;
      }
      if ((ushort)XVar4 < 0xe) {
        if ((((ushort)XVar4 < 0xe) && ((0x2600U >> ((ushort)XVar4 & 0x1f) & 1) != 0)) &&
           ((XVar4 = L' ', (this->super_XMLScanner).fStandalone == true &&
            ((this->super_XMLScanner).fValidate == true && local_41 == 0)))) {
          XMLValidator::emitError
                    ((this->super_XMLScanner).fValidator,NoAttNormForStandalone,attName,(XMLCh *)0x0
                     ,(XMLCh *)0x0,(XMLCh *)0x0);
        }
      }
      else if (XVar4 == L'<') {
        bVar6 = false;
        XMLScanner::emitError
                  (&this->super_XMLScanner,BracketInAttrValue,attName,(XMLCh *)0x0,(XMLCh *)0x0,
                   (XMLCh *)0x0);
        XVar4 = L'<';
      }
    }
    XMLBuffer::append(toFill,XVar4);
    value = value + 1;
  } while( true );
}

Assistant:

bool SGXMLScanner::normalizeAttValue( const   XMLAttDef* const    attDef
                                      , const XMLCh* const        attName
                                      , const XMLCh* const        value
                                      ,       XMLBuffer&          toFill)
{
    // A simple state value for a whitespace processing state machine
    enum States
    {
        InWhitespace
        , InContent
    };

    // Get the type and name
    const XMLAttDef::AttTypes type = (attDef)
                            ?attDef->getType()
                            :XMLAttDef::CData;

    // Assume its going to go fine, and empty the target buffer in preperation
    bool retVal = true;
    toFill.reset();

    // check to see if it's a tokenized type that is declared externally 
    bool  isAttTokenizedExternal = (attDef)
                                   ?attDef->isExternal() && (type == XMLAttDef::ID || 
                                                             type == XMLAttDef::IDRef || 
                                                             type == XMLAttDef::IDRefs || 
                                                             type == XMLAttDef::Entity || 
                                                             type == XMLAttDef::Entities || 
                                                             type == XMLAttDef::NmToken || 
                                                             type == XMLAttDef::NmTokens)
                                   :false;

    //  Loop through the chars of the source value and normalize it according
    //  to the type.
    States curState = InContent;
    bool firstNonWS = false;
    XMLCh nextCh;
    const XMLCh* srcPtr = value;

    if (type == XMLAttDef::CData || type > XMLAttDef::Notation) {
        while (*srcPtr) {
            //  Get the next character from the source. We have to watch for
            //  escaped characters (which are indicated by a 0xFFFF value followed
            //  by the char that was escaped.)
            nextCh = *srcPtr;

            // Do we have an escaped character ?
            if (nextCh == 0xFFFF)
            {
                nextCh = *++srcPtr;
            }
            else if ( (nextCh <= 0x0D) && (nextCh == 0x09 || nextCh == 0x0A || nextCh == 0x0D) ) {
                // Check Validity Constraint for Standalone document declaration
                // XML 1.0, Section 2.9
                if (fStandalone && fValidate && isAttTokenizedExternal)
                {
                     // Can't have a standalone document declaration of "yes" if  attribute
                     // values are subject to normalisation
                     fValidator->emitError(XMLValid::NoAttNormForStandalone, attName);
                }
                nextCh = chSpace;
            }
            else if (nextCh == chOpenAngle) {
                //  If its not escaped, then make sure its not a < character, which is
                //  not allowed in attribute values.
                emitError(XMLErrs::BracketInAttrValue, attName);
                retVal = false;
            }

            // Add this char to the target buffer
            toFill.append(nextCh);

            // And move up to the next character in the source
            srcPtr++;
        }
    }
    else {
        while (*srcPtr)
        {
            //  Get the next character from the source. We have to watch for
            //  escaped characters (which are indicated by a 0xFFFF value followed
            //  by the char that was escaped.)
            nextCh = *srcPtr;

            // Do we have an escaped character ?
            if (nextCh == 0xFFFF)
            {
                nextCh = *++srcPtr;
            }
            else if (nextCh == chOpenAngle) {
                //  If its not escaped, then make sure its not a < character, which is
                //  not allowed in attribute values.
                emitError(XMLErrs::BracketInAttrValue, attName);
                retVal = false;
            }

            if (curState == InWhitespace)
            {
                if (!fReaderMgr.getCurrentReader()->isWhitespace(nextCh))
                {
                    if (firstNonWS)
                        toFill.append(chSpace);
                    curState = InContent;
                    firstNonWS = true;
                }
                else
                {
                    srcPtr++;
                    continue;
                }
            }
            else if (curState == InContent)
            {
                if (fReaderMgr.getCurrentReader()->isWhitespace(nextCh))
                {
                    curState = InWhitespace;
                    srcPtr++;

                    // Check Validity Constraint for Standalone document declaration
                    // XML 1.0, Section 2.9
                    if (fStandalone && fValidate && isAttTokenizedExternal)
                    {
                        if (!firstNonWS || (nextCh != chSpace && *srcPtr && fReaderMgr.getCurrentReader()->isWhitespace(*srcPtr)))
                        {
                            // Can't have a standalone document declaration of "yes" if  attribute
                            // values are subject to normalisation
                            fValidator->emitError(XMLValid::NoAttNormForStandalone, attName);
                        }
                    }
                    continue;
                }
                firstNonWS = true;
            }

            // Add this char to the target buffer
            toFill.append(nextCh);

            // And move up to the next character in the source
            srcPtr++;
        }
    }

    return retVal;
}